

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualExpression.cpp
# Opt level: O1

void __thiscall
ninx::parser::element::EqualExpression::EqualExpression
          (EqualExpression *this,
          unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
          *first,unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *second)

{
  pointer *__ptr;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_18;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_10;
  
  local_10._M_head_impl =
       (first->_M_t).
       super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
       ._M_t.
       super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
       .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (first->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (Expression *)0x0;
  local_18._M_head_impl =
       (second->_M_t).
       super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
       ._M_t.
       super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
       .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (second->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (Expression *)0x0;
  BinaryExpression::BinaryExpression
            (&this->super_BinaryExpression,
             (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
              *)&local_10,
             (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
              *)&local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement[1])();
  }
  local_18._M_head_impl = (Expression *)0x0;
  if (local_10._M_head_impl != (Expression *)0x0) {
    (*((local_10._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement[1])();
  }
  (this->super_BinaryExpression).super_Expression.super_Statement.super_ASTElement._vptr_ASTElement
       = (_func_int **)&PTR__BinaryExpression_00150680;
  return;
}

Assistant:

ninx::parser::element::EqualExpression::EqualExpression(std::unique_ptr<ninx::parser::element::Expression> first,
                                                    std::unique_ptr<ninx::parser::element::Expression> second)
        : BinaryExpression(std::move(first), std::move(second)) {


}